

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::SmokeTest::draw
          (SmokeTest *this,GLenum target,GLint *texture_swizzle,bool use_rgba_enum)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  bool use_rgba_enum_local;
  GLint *texture_swizzle_local;
  GLenum target_local;
  SmokeTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 8))(0x84c0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"ActiveTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa3a);
  (**(code **)(lVar4 + 0xb8))(target,this->m_source_tex_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa3d);
  if (use_rgba_enum) {
    (**(code **)(lVar4 + 0x1368))(target,0x8e46,texture_swizzle);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"TexParameteriv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xa43);
  }
  else {
    (**(code **)(lVar4 + 0x1360))(target,0x8e42,*texture_swizzle);
    (**(code **)(lVar4 + 0x1360))(target,0x8e43,texture_swizzle[1]);
    (**(code **)(lVar4 + 0x1360))(target,0x8e44,texture_swizzle[2]);
    (**(code **)(lVar4 + 0x1360))(target,0x8e45,texture_swizzle[3]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xa4b);
  }
  (**(code **)(lVar4 + 0x188))(0x4000);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa50);
  (**(code **)(lVar4 + 0x538))(5,0,4);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa54);
  (**(code **)(lVar4 + 0x1360))(target,0x8e42,0x1903);
  (**(code **)(lVar4 + 0x1360))(target,0x8e43,0x1904);
  (**(code **)(lVar4 + 0x1360))(target,0x8e44,0x1905);
  (**(code **)(lVar4 + 0x1360))(target,0x8e45,0x1906);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"TexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa5b);
  (**(code **)(lVar4 + 0xb8))(target,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xa5f);
  return;
}

Assistant:

void SmokeTest::draw(glw::GLenum target, const glw::GLint* texture_swizzle, bool use_rgba_enum)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare source texture */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

	gl.bindTexture(target, m_source_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Set texture swizzle */
	if (true == use_rgba_enum)
	{
		gl.texParameteriv(target, GL_TEXTURE_SWIZZLE_RGBA, texture_swizzle);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteriv");
	}
	else
	{
		gl.texParameteri(target, GL_TEXTURE_SWIZZLE_R, texture_swizzle[0]);
		gl.texParameteri(target, GL_TEXTURE_SWIZZLE_G, texture_swizzle[1]);
		gl.texParameteri(target, GL_TEXTURE_SWIZZLE_B, texture_swizzle[2]);
		gl.texParameteri(target, GL_TEXTURE_SWIZZLE_A, texture_swizzle[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
	}

	/* Clear */
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");

	/* Draw */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Revert texture swizzle */
	gl.texParameteri(target, GL_TEXTURE_SWIZZLE_R, GL_RED);
	gl.texParameteri(target, GL_TEXTURE_SWIZZLE_G, GL_GREEN);
	gl.texParameteri(target, GL_TEXTURE_SWIZZLE_B, GL_BLUE);
	gl.texParameteri(target, GL_TEXTURE_SWIZZLE_A, GL_ALPHA);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

	/* Unbind source texture */
	gl.bindTexture(target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}